

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O2

void uv__stream_io(uv_loop_t *loop,uv__io_t *w,uint events)

{
  byte *pbVar1;
  uv_stream_t *stream;
  size_t sVar2;
  uint uVar3;
  long lVar4;
  size_t sVar5;
  int iVar6;
  long lVar7;
  int *piVar8;
  uint *puVar9;
  cmsghdr *__cmsg;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  bool bVar16;
  bool bVar17;
  undefined8 uStack_1d0;
  uv_buf_t buf;
  msghdr msg;
  int error;
  undefined4 uStack_144;
  size_t sStack_140;
  
  uVar13 = w[-3].fd;
  if ((0xe < uVar13) || ((0x5080U >> (uVar13 & 0x1f) & 1) == 0)) {
    __assert_fail("stream->type == UV_TCP || stream->type == UV_NAMED_PIPE || stream->type == UV_TTY"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/sosopop[P]asterism/3rdparty/libuv/src/unix/stream.c"
                  ,0x4df,"void uv__stream_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if ((*(uint *)w[-1].pending_queue & 1) != 0) {
    __assert_fail("!(stream->flags & UV_CLOSING)",
                  "/workspace/llm4binary/github/license_c_cmakelists/sosopop[P]asterism/3rdparty/libuv/src/unix/stream.c"
                  ,0x4e0,"void uv__stream_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  stream = (uv_stream_t *)(w[-3].watcher_queue + 1);
  lVar7 = *(long *)&w[-1].pevents;
  if (lVar7 != 0) {
    msg.msg_name = (void *)CONCAT44(msg.msg_name._4_4_,4);
    if ((uVar13 != 7) && (uVar13 != 0xc)) {
      __assert_fail("stream->type == UV_TCP || stream->type == UV_NAMED_PIPE",
                    "/workspace/llm4binary/github/license_c_cmakelists/sosopop[P]asterism/3rdparty/libuv/src/unix/stream.c"
                    ,0x516,"void uv__stream_connect(uv_stream_t *)");
    }
    uVar13 = w[1].pevents;
    if (uVar13 == 0) {
      if (w->fd < 0) {
        __assert_fail("uv__stream_fd(stream) >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/sosopop[P]asterism/3rdparty/libuv/src/unix/stream.c"
                      ,0x522,"void uv__stream_connect(uv_stream_t *)");
      }
      getsockopt(w->fd,1,4,&error,(socklen_t *)&msg);
      uVar13 = -error;
      _error = (char *)CONCAT44(uStack_144,uVar13);
    }
    else {
      _error = (char *)CONCAT44(uStack_144,uVar13);
      w[1].pevents = 0;
    }
    if (uVar13 == 0xffffff8d) {
      return;
    }
    w[-1].pevents = 0;
    w[-1].events = 0;
    if (*(long *)&w[-3].pevents + 0x20 == *(long *)(*(long *)&w[-3].pevents + 0x20)) {
      __assert_fail("uv__has_active_reqs(stream->loop)",
                    "/workspace/llm4binary/github/license_c_cmakelists/sosopop[P]asterism/3rdparty/libuv/src/unix/stream.c"
                    ,0x52f,"void uv__stream_connect(uv_stream_t *)");
    }
    lVar4 = *(long *)(lVar7 + 0x10);
    **(long **)(lVar7 + 0x18) = lVar4;
    *(undefined8 *)(lVar4 + 8) = *(undefined8 *)(lVar7 + 0x18);
    if (((int)uVar13 < 0) || (w + 1 == (uv__io_t *)w[1].cb)) {
      uv__io_stop(*(uv_loop_t **)&w[-3].pevents,w,4);
      uVar13 = error;
    }
    if (*(code **)(lVar7 + 0x40) != (code *)0x0) {
      (**(code **)(lVar7 + 0x40))(lVar7);
      uVar13 = error;
    }
    if (w->fd == -1) {
      return;
    }
    if (-1 < (int)uVar13) {
      return;
    }
    uv__stream_flush_write_queue(stream,-0x7d);
    uv__write_callbacks(stream);
    return;
  }
  iVar15 = w->fd;
  if (iVar15 < 0) {
    __assert_fail("uv__stream_fd(stream) >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/sosopop[P]asterism/3rdparty/libuv/src/unix/stream.c"
                  ,0x4e7,"void uv__stream_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if ((events & 0x19) != 0) {
    *(uint *)w[-1].pending_queue = *(uint *)w[-1].pending_queue & 0xfffffefe;
    if (uVar13 == 7) {
      bVar17 = *(int *)&w[2].cb != 0;
    }
    else {
      bVar17 = false;
    }
    iVar15 = 0x20;
    do {
      if (((w[-1].watcher_queue[1] == (void *)0x0) || (((ulong)w[-1].pending_queue[0] & 4) == 0)) ||
         (bVar16 = iVar15 == 0, iVar15 = iVar15 + -1, bVar16)) goto LAB_00115814;
      if ((code *)w[-1].watcher_queue[0] == (code *)0x0) {
        __assert_fail("stream->alloc_cb != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/sosopop[P]asterism/3rdparty/libuv/src/unix/stream.c"
                      ,0x463,"void uv__read(uv_stream_t *)");
      }
      (*(code *)w[-1].watcher_queue[0])(stream,0x10000,&buf);
      if (buf.len == 0) {
        uStack_1d0 = 0xffffffffffffff97;
        goto LAB_0011576a;
      }
      if (buf.base == (char *)0x0) {
        __assert_fail("buf.base != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/sosopop[P]asterism/3rdparty/libuv/src/unix/stream.c"
                      ,0x46c,"void uv__read(uv_stream_t *)");
      }
      if (w->fd < 0) {
        __assert_fail("uv__stream_fd(stream) >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/sosopop[P]asterism/3rdparty/libuv/src/unix/stream.c"
                      ,0x46d,"void uv__read(uv_stream_t *)");
      }
      if (bVar17) {
        msg.msg_flags = 0;
        msg.msg_iovlen = 1;
        msg.msg_name = (void *)0x0;
        msg.msg_namelen = 0;
        msg.msg_controllen = 0x110;
        msg.msg_control = &error;
        msg.msg_iov = (iovec *)&buf;
        while (lVar7 = uv__recvmsg(w->fd,&msg,0), lVar7 < 0) {
          piVar8 = __errno_location();
          iVar6 = *piVar8;
          if (iVar6 != 4) goto LAB_00115747;
        }
      }
      else {
        while (lVar7 = read(w->fd,buf.base,buf.len), lVar7 < 0) {
          piVar8 = __errno_location();
          iVar6 = *piVar8;
          if (iVar6 != 4) goto LAB_00115747;
        }
      }
      sVar5 = buf.len;
      if (lVar7 == 0) {
        uv__stream_eof(stream,&buf);
        goto LAB_00115814;
      }
      if (bVar17) {
        __cmsg = (cmsghdr *)msg.msg_control;
        if (msg.msg_controllen < 0x10) {
          __cmsg = (cmsghdr *)0x0;
        }
        for (; __cmsg != (cmsghdr *)0x0; __cmsg = __cmsg_nxthdr((msghdr *)&msg,__cmsg)) {
          if (__cmsg->cmsg_type == 1) {
            uVar14 = 0xffffffff;
            uVar13 = 0;
            do {
              uVar11 = uVar13;
              uVar14 = (ulong)((int)uVar14 + 1);
              sVar2 = uVar14 * 4 + 0x10;
              uVar13 = uVar11 + 1;
            } while ((long)sVar2 < (long)__cmsg->cmsg_len);
            if (sVar2 != __cmsg->cmsg_len) {
              __assert_fail("start + CMSG_LEN(count * sizeof(*pi)) == end",
                            "/workspace/llm4binary/github/license_c_cmakelists/sosopop[P]asterism/3rdparty/libuv/src/unix/stream.c"
                            ,0x430,"int uv__stream_recv_cmsg(uv_stream_t *, struct msghdr *)");
            }
            uVar12 = 0;
LAB_00115635:
            if (uVar11 != uVar12) {
              uVar13 = *(uint *)((long)&__cmsg[1].cmsg_len + uVar12 * 4);
              puVar9 = &w[1].events;
              if (w[1].events == 0xffffffff) goto LAB_001156db;
              puVar9 = *(uint **)&w[1].fd;
              if (puVar9 != (uint *)0x0) {
                uVar3 = *puVar9;
                uVar10 = puVar9[1];
                if (uVar3 == uVar10) {
                  puVar9 = (uint *)uv__realloc(puVar9,(ulong)(uVar3 + 7) * 4 + 0xc);
                  if (puVar9 == (uint *)0x0) goto LAB_001157d8;
                  *puVar9 = uVar3 + 8;
                  *(uint **)&w[1].fd = puVar9;
                  uVar10 = puVar9[1];
                }
LAB_001156c6:
                puVar9[1] = uVar10 + 1;
                puVar9 = puVar9 + (ulong)uVar10 + 2;
                goto LAB_001156db;
              }
              puVar9 = (uint *)uv__malloc(0x28);
              if (puVar9 != (uint *)0x0) {
                puVar9[0] = 8;
                puVar9[1] = 0;
                *(uint **)&w[1].fd = puVar9;
                uVar10 = 0;
                goto LAB_001156c6;
              }
LAB_001157d8:
              if (uVar14 < uVar12) {
                uVar14 = uVar12;
              }
              for (; uVar14 != uVar12; uVar12 = uVar12 + 1) {
                uv__close(*(int *)((long)&__cmsg[1].cmsg_len + uVar12 * 4));
              }
              (*(code *)w[-1].watcher_queue[1])(stream,0xfffffffffffffff4,&buf);
              goto LAB_00115814;
            }
            goto LAB_001156fd;
          }
          fprintf(_stderr,"ignoring non-SCM_RIGHTS ancillary data: %d\n");
LAB_001156fd:
        }
      }
      (*(code *)w[-1].watcher_queue[1])(stream,lVar7,&buf);
    } while ((long)sVar5 <= lVar7);
    pbVar1 = (byte *)((long)w[-1].pending_queue + 1);
    *pbVar1 = *pbVar1 | 1;
    goto LAB_00115814;
  }
  goto LAB_00115821;
LAB_001156db:
  *puVar9 = uVar13;
  uVar12 = uVar12 + 1;
  goto LAB_00115635;
LAB_00115747:
  if (iVar6 == 0xb) {
    if (((ulong)w[-1].pending_queue[0] & 4) != 0) {
      uv__io_start(*(uv_loop_t **)&w[-3].pevents,w,1);
    }
    uStack_1d0 = 0;
LAB_0011576a:
    (*(code *)w[-1].watcher_queue[1])(stream,uStack_1d0,&buf);
  }
  else {
    (*(code *)w[-1].watcher_queue[1])(stream,(long)-iVar6,&buf);
    if ((*(uint *)w[-1].pending_queue & 4) != 0) {
      *(uint *)w[-1].pending_queue = *(uint *)w[-1].pending_queue & 0xfffffffb;
      uv__io_stop(*(uv_loop_t **)&w[-3].pevents,w,1);
      iVar15 = uv__io_active(w,4);
      if (((iVar15 == 0) && (uVar13 = *(uint *)w[-1].pending_queue, (uVar13 >> 0xe & 1) != 0)) &&
         (*(uint *)w[-1].pending_queue = uVar13 & 0xffffbfff, (uVar13 >> 0xd & 1) != 0)) {
        piVar8 = (int *)(*(long *)&w[-3].pevents + 8);
        *piVar8 = *piVar8 + -1;
      }
    }
  }
LAB_00115814:
  iVar15 = w->fd;
  if (iVar15 == -1) {
    return;
  }
LAB_00115821:
  if (((events & 0x10) != 0) && (((ulong)w[-1].pending_queue[0] & 0x304) == 0x104)) {
    _error = (char *)0x0;
    sStack_140 = 0;
    uv__stream_eof(stream,(uv_buf_t *)&error);
    iVar15 = w->fd;
  }
  if ((events & 0x1c) == 0) {
    return;
  }
  if (iVar15 == -1) {
    return;
  }
  uv__write(stream);
  uv__write_callbacks(stream);
  if (w + 1 != (uv__io_t *)w[1].cb) {
    return;
  }
  uv__io_stop(*(uv_loop_t **)&w[-3].pevents,w,4);
  if ((*(uint *)w[-1].pending_queue & 0x19) != 8) {
    return;
  }
  lVar7 = *(long *)&w[-1].fd;
  if (lVar7 == 0) {
    __assert_fail("stream->shutdown_req",
                  "/workspace/llm4binary/github/license_c_cmakelists/sosopop[P]asterism/3rdparty/libuv/src/unix/stream.c"
                  ,0x29e,"void uv__drain(uv_stream_t *)");
  }
  *(undefined8 *)&w[-1].fd = 0;
  *(uint *)w[-1].pending_queue = *(uint *)w[-1].pending_queue & 0xffffffe6;
  if (*(long *)&w[-3].pevents + 0x20 == *(long *)(*(long *)&w[-3].pevents + 0x20)) {
    __assert_fail("uv__has_active_reqs(stream->loop)",
                  "/workspace/llm4binary/github/license_c_cmakelists/sosopop[P]asterism/3rdparty/libuv/src/unix/stream.c"
                  ,0x2a3,"void uv__drain(uv_stream_t *)");
  }
  lVar4 = *(long *)(lVar7 + 0x10);
  **(long **)(lVar7 + 0x18) = lVar4;
  *(undefined8 *)(lVar4 + 8) = *(undefined8 *)(lVar7 + 0x18);
  iVar15 = shutdown(w->fd,1);
  if (iVar15 != 0) {
    piVar8 = __errno_location();
    if (*piVar8 != 0) {
      iVar15 = -*piVar8;
      goto LAB_00115903;
    }
  }
  *(byte *)w[-1].pending_queue = *(byte *)w[-1].pending_queue | 0x10;
  iVar15 = 0;
LAB_00115903:
  if (*(code **)(lVar7 + 0x48) != (code *)0x0) {
    (**(code **)(lVar7 + 0x48))(lVar7,iVar15);
  }
  return;
}

Assistant:

static void uv__stream_io(uv_loop_t* loop, uv__io_t* w, unsigned int events) {
  uv_stream_t* stream;

  stream = container_of(w, uv_stream_t, io_watcher);

  assert(stream->type == UV_TCP ||
         stream->type == UV_NAMED_PIPE ||
         stream->type == UV_TTY);
  assert(!(stream->flags & UV_CLOSING));

  if (stream->connect_req) {
    uv__stream_connect(stream);
    return;
  }

  assert(uv__stream_fd(stream) >= 0);

  /* Ignore POLLHUP here. Even it it's set, there may still be data to read. */
  if (events & (POLLIN | POLLERR | POLLHUP))
    uv__read(stream);

  if (uv__stream_fd(stream) == -1)
    return;  /* read_cb closed stream. */

  /* Short-circuit iff POLLHUP is set, the user is still interested in read
   * events and uv__read() reported a partial read but not EOF. If the EOF
   * flag is set, uv__read() called read_cb with err=UV_EOF and we don't
   * have to do anything. If the partial read flag is not set, we can't
   * report the EOF yet because there is still data to read.
   */
  if ((events & POLLHUP) &&
      (stream->flags & UV_STREAM_READING) &&
      (stream->flags & UV_STREAM_READ_PARTIAL) &&
      !(stream->flags & UV_STREAM_READ_EOF)) {
    uv_buf_t buf = { NULL, 0 };
    uv__stream_eof(stream, &buf);
  }

  if (uv__stream_fd(stream) == -1)
    return;  /* read_cb closed stream. */

  if (events & (POLLOUT | POLLERR | POLLHUP)) {
    uv__write(stream);
    uv__write_callbacks(stream);

    /* Write queue drained. */
    if (QUEUE_EMPTY(&stream->write_queue))
      uv__drain(stream);
  }
}